

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Steiner.cpp
# Opt level: O2

void __thiscall Steiner::outfile(Steiner *this,string *outfileName)

{
  pointer pPVar1;
  pointer pPVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer pPVar6;
  pointer pEVar7;
  ostream *poVar8;
  uint uVar9;
  ulong uVar10;
  reference rVar11;
  ofstream of;
  
  std::ofstream::ofstream((ostream *)&of,(string *)outfileName,_S_out);
  poVar8 = std::operator<<((ostream *)&of,"NumRoutedPins = ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->_init_p);
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)&of,"WireLength = ");
  poVar8 = std::ostream::_M_insert<long_long>((longlong)poVar8);
  std::endl<char,std::char_traits<char>>(poVar8);
  uVar9 = 0;
  while( true ) {
    uVar10 = (ulong)uVar9;
    piVar5 = (this->_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar5 >> 2) <= uVar10) break;
    rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (&this->_edges_del,(long)piVar5[uVar10]);
    if ((*rVar11._M_p & rVar11._M_mask) == 0) {
      iVar3 = (this->_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar10];
      pPVar6 = (this->_points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
               super__Vector_impl_data._M_start;
      pEVar7 = (this->_edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar4 = pEVar7[iVar3].p1;
      pPVar1 = pPVar6 + iVar4;
      iVar3 = pEVar7[iVar3].p2;
      pPVar2 = pPVar6 + iVar3;
      if (pPVar6[iVar4].x != pPVar6[iVar3].x) {
        poVar8 = std::operator<<((ostream *)&of,"H-line ");
        poVar8 = std::operator<<(poVar8,"(");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar1->x);
        poVar8 = std::operator<<(poVar8,",");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar1->y);
        poVar8 = std::operator<<(poVar8,") ");
        poVar8 = std::operator<<(poVar8,"(");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar2->x);
        poVar8 = std::operator<<(poVar8,",");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar1->y);
        poVar8 = std::operator<<(poVar8,")");
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      if (pPVar1->y != pPVar2->y) {
        poVar8 = std::operator<<((ostream *)&of,"V-line ");
        poVar8 = std::operator<<(poVar8,"(");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar2->x);
        poVar8 = std::operator<<(poVar8,",");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar1->y);
        poVar8 = std::operator<<(poVar8,") ");
        poVar8 = std::operator<<(poVar8,"(");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar2->x);
        poVar8 = std::operator<<(poVar8,",");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar2->y);
        poVar8 = std::operator<<(poVar8,")");
        std::endl<char,std::char_traits<char>>(poVar8);
      }
    }
    uVar9 = uVar9 + 1;
  }
  uVar9 = 0;
  while( true ) {
    uVar10 = (ulong)uVar9;
    pEVar7 = (this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pEVar7) / 0x14) <= uVar10) break;
    pPVar6 = (this->_points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
             super__Vector_impl_data._M_start;
    pPVar1 = pPVar6 + pEVar7[uVar10].p1;
    pPVar2 = pPVar6 + pEVar7[uVar10].p2;
    if (pPVar6[pEVar7[uVar10].p1].x != pPVar6[pEVar7[uVar10].p2].x) {
      poVar8 = std::operator<<((ostream *)&of,"H-line ");
      poVar8 = std::operator<<(poVar8,"(");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar1->x);
      poVar8 = std::operator<<(poVar8,",");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar1->y);
      poVar8 = std::operator<<(poVar8,") ");
      poVar8 = std::operator<<(poVar8,"(");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar2->x);
      poVar8 = std::operator<<(poVar8,",");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar1->y);
      poVar8 = std::operator<<(poVar8,")");
      std::endl<char,std::char_traits<char>>(poVar8);
    }
    if (pPVar1->y != pPVar2->y) {
      poVar8 = std::operator<<((ostream *)&of,"V-line ");
      poVar8 = std::operator<<(poVar8,"(");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar2->x);
      poVar8 = std::operator<<(poVar8,",");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar1->y);
      poVar8 = std::operator<<(poVar8,") ");
      poVar8 = std::operator<<(poVar8,"(");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar2->x);
      poVar8 = std::operator<<(poVar8,",");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar2->y);
      poVar8 = std::operator<<(poVar8,")");
      std::endl<char,std::char_traits<char>>(poVar8);
    }
    uVar9 = uVar9 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&of);
  return;
}

Assistant:

void Steiner::outfile(const string& outfileName) {
  ofstream of(outfileName, ofstream::out);
  of << "NumRoutedPins = " << _init_p << endl;
  of << "WireLength = " << _MRST_cost << endl;
  for (unsigned i = 0; i < _MST.size(); ++i) {
    if (_edges_del[_MST[i]]) continue;
    Point& p1 = _points[_edges[_MST[i]].p1];
    Point& p2 = _points[_edges[_MST[i]].p2];
    if (p1.x != p2.x) {
      of << "H-line "
         << "(" << p1.x << "," << p1.y << ") "
         << "(" << p2.x << "," << p1.y << ")"
         << endl;
    }
    if (p1.y != p2.y) {
      of << "V-line "
         << "(" << p2.x << "," << p1.y << ") "
         << "(" << p2.x << "," << p2.y << ")"
         << endl;
    }
  }
  for (unsigned i = 0; i < _newE.size(); ++i) {
    Point& p1 = _points[_newE[i].p1];
    Point& p2 = _points[_newE[i].p2];
    if (p1.x != p2.x) {
      of << "H-line "
         << "(" << p1.x << "," << p1.y << ") "
         << "(" << p2.x << "," << p1.y << ")"
         << endl;
    }
    if (p1.y != p2.y) {
      of << "V-line "
         << "(" << p2.x << "," << p1.y << ") "
         << "(" << p2.x << "," << p2.y << ")"
         << endl;
    }
  }
  of.close();
}